

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmMakefile *this_00;
  cmTarget *pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  pointer ppcVar6;
  mapped_type *this_01;
  _Rb_tree_node_base *p_Var7;
  bool hasSourceExtension;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  string dir;
  cmGeneratorTargetsType targets;
  string objectName;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  bool local_169;
  cmLocalUnixMakefileGenerator3 *local_168;
  cmGeneratorTarget *local_160;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_158;
  _Rb_tree_node_base *local_138;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  *local_130;
  pointer local_128;
  cmSourceFile *local_120;
  string local_118;
  undefined1 local_f8 [40];
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  local_d0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168 = this;
  local_130 = localObjectFiles;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::_Rb_tree(&local_d0,&(((this->super_cmLocalGenerator).Makefile)->GeneratorTargets)._M_t);
  for (p_Var7 = local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &local_d0._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    local_160 = (cmGeneratorTarget *)p_Var7[1]._M_parent;
    iVar4 = cmGeneratorTarget::GetType(local_160);
    if (iVar4 != 7) {
      local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (local_168->super_cmLocalGenerator).Makefile;
      std::__cxx11::string::string((string *)&local_118,"CMAKE_BUILD_TYPE",(allocator *)&local_80);
      pcVar5 = cmMakefile::GetSafeDefinition(this_00,&local_118);
      std::__cxx11::string::string((string *)local_f8,pcVar5,(allocator *)&local_a0);
      pcVar2 = local_160;
      cmGeneratorTarget::GetObjectSources
                (local_160,
                 (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_158,
                 (string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      cmMakefile::GetCurrentBinaryDirectory(pcVar2->Makefile);
      std::__cxx11::string::append((char *)&local_118);
      std::__cxx11::string::append((char *)&local_118);
      (*(local_168->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
                ((LocalObjectEntry *)local_f8,local_168,local_160->Target);
      std::__cxx11::string::append((string *)&local_118);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::append((char *)&local_118);
      ppcVar6 = local_158._M_impl.super__Vector_impl_data._M_start;
      local_138 = p_Var7;
      while( true ) {
        pcVar2 = local_160;
        if (ppcVar6 == local_158._M_impl.super__Vector_impl_data._M_finish) break;
        local_120 = *ppcVar6;
        local_169 = true;
        local_128 = ppcVar6;
        cmLocalGenerator::GetObjectFileNameWithoutTarget
                  (&local_80,&local_168->super_cmLocalGenerator,local_120,&local_118,&local_169);
        bVar3 = cmsys::SystemTools::FileIsFullPath(local_80._M_dataplus._M_p);
        if (bVar3) {
          cmsys::SystemTools::GetFilenameName((string *)local_f8,&local_80);
          std::__cxx11::string::operator=((string *)&local_80,(string *)local_f8);
          std::__cxx11::string::~string((string *)local_f8);
        }
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                  ::operator[](local_130,&local_80);
        this_01->HasSourceExtension = local_169;
        pcVar1 = pcVar2->Target;
        cmSourceFile::GetLanguage_abi_cxx11_(&local_a0,local_120);
        local_f8._0_8_ = pcVar1;
        std::__cxx11::string::string((string *)(local_f8 + 8),(string *)&local_a0);
        std::
        vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
        ::emplace_back<cmLocalUnixMakefileGenerator3::LocalObjectEntry>
                  (&this_01->
                    super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                   ,(LocalObjectEntry *)local_f8);
        std::__cxx11::string::~string((string *)(local_f8 + 8));
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_80);
        ppcVar6 = local_128 + 1;
      }
      std::__cxx11::string::~string((string *)&local_118);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&local_158);
      p_Var7 = local_138;
    }
  }
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree(&local_d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::
GetLocalObjectFiles(std::map<std::string, LocalObjectInfo> &localObjectFiles)
{
  std::set<std::string> emitted;
  cmGeneratorTargetsType targets = this->Makefile->GetGeneratorTargets();
  for(cmGeneratorTargetsType::iterator ti = targets.begin();
      ti != targets.end(); ++ti)
    {
    cmGeneratorTarget* gt = ti->second;
    if (gt->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, this->Makefile
                                    ->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    // Compute full path to object file directory for this target.
    std::string dir;
    dir += gt->Makefile->GetCurrentBinaryDirectory();
    dir += "/";
    dir += this->GetTargetDirectory(*gt->Target);
    dir += "/";
    // Compute the name of each object file.
    for(std::vector<cmSourceFile const*>::iterator
          si = objectSources.begin();
        si != objectSources.end(); ++si)
      {
      cmSourceFile const* sf = *si;
      bool hasSourceExtension = true;
      std::string objectName = this->GetObjectFileNameWithoutTarget(*sf,
                                                                    dir,
                                                        &hasSourceExtension);
      if(cmSystemTools::FileIsFullPath(objectName.c_str()))
        {
        objectName = cmSystemTools::GetFilenameName(objectName);
        }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.push_back(LocalObjectEntry(gt->Target, sf->GetLanguage()));
      }
    }
}